

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

void __thiscall xercesc_4_0::WFElemStack::addPrefix(WFElemStack *this,XMLCh *prefixToAdd,uint uriId)

{
  StackElem *pSVar1;
  uint uVar2;
  EmptyStackException *this_00;
  uint prefId;
  StackElem *curRow;
  uint uriId_local;
  XMLCh *prefixToAdd_local;
  WFElemStack *this_local;
  
  if (this->fStackTop == 0) {
    this_00 = (EmptyStackException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,0x2d0,ElemStack_EmptyStack,this->fMemoryManager);
    __cxa_throw(this_00,&EmptyStackException::typeinfo,EmptyStackException::~EmptyStackException);
  }
  pSVar1 = this->fStack[this->fStackTop - 1];
  uVar2 = XMLStringPool::addOrFind(&this->fPrefixPool,prefixToAdd);
  if ((ulong)(pSVar1->fTopPrefix + 1) == this->fMapCapacity) {
    expandMap(this);
  }
  this->fMap[pSVar1->fTopPrefix + 1].fPrefId = uVar2;
  if ((uVar2 == this->fGlobalPoolId) && (uriId == this->fEmptyNamespaceId)) {
    this->fMap[pSVar1->fTopPrefix + 1].fURIId = this->fEmptyNamespaceId;
  }
  else {
    this->fMap[pSVar1->fTopPrefix + 1].fURIId = uriId;
  }
  pSVar1->fTopPrefix = pSVar1->fTopPrefix + 1;
  return;
}

Assistant:

void WFElemStack::addPrefix(  const   XMLCh* const    prefixToAdd
                              , const unsigned int    uriId)
{
    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if ((unsigned int)curRow->fTopPrefix + 1 == fMapCapacity)
        expandMap();

    //
    //  And now add a new element for this prefix. Watch for the special case
    //  of xmlns=="", and force it to ""=[globalid]
    //
    fMap[curRow->fTopPrefix + 1].fPrefId = prefId;
    if ((prefId == fGlobalPoolId) && (uriId == fEmptyNamespaceId))
        fMap[curRow->fTopPrefix + 1].fURIId = fEmptyNamespaceId;
    else
        fMap[curRow->fTopPrefix + 1].fURIId = uriId;

    // Bump the map count now
    curRow->fTopPrefix++;
}